

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ostream *poVar1;
  Framebuffer image;
  World world;
  PointLight fill;
  Sphere middle;
  Group spheres;
  Sphere left;
  Tuple4d from;
  Camera camera;
  Plane floor;
  Sphere right;
  Tuple4d up;
  Tuple4d to;
  PointLight key;
  CheckerMaterial grid;
  RingMaterial ring;
  GradientMaterial gradient;
  StripeMaterial stripes;
  undefined1 local_a38 [16];
  undefined1 local_a28 [120];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_9b0;
  shared_ptr<material::Material> local_9a8;
  shared_ptr<material::Material> local_998;
  shared_ptr<material::Material> local_988;
  shared_ptr<material::Material> local_978;
  Framebuffer local_968;
  World local_950;
  PointLight local_908;
  Primitive local_8c8;
  Group local_828;
  Primitive local_730;
  Tuple4d local_690;
  Camera local_670;
  Primitive local_5d0;
  Primitive local_530;
  Tuple4d local_490;
  Tuple4d local_470;
  Matrix4d local_450;
  Pattern local_3d0;
  Pattern local_2e0;
  Pattern local_1f0;
  Pattern local_100;
  
  ::image::Color::Color((Color *)&local_828,1.0,1.0,1.0);
  scene::World::World(&local_950,(Color *)&local_828);
  ::image::Color::Color((Color *)&local_2e0,0.8431372549019608,0.6980392156862745,1.0);
  ::image::Color::Color
            ((Color *)&local_3d0,0.5764705882352941,0.8470588235294118,0.5803921568627451);
  math::identity();
  math::Matrix4d::scale((Matrix4d *)&local_828,(Matrix4d *)&local_1f0,0.5,0.5,0.5);
  material::pattern::Pattern::Pattern
            (&local_100,(Color *)&local_2e0,(Color *)&local_3d0,(Matrix4d *)&local_828,0.1,0.9,1.0,
             200.0,0.0,0.0,1.0);
  local_100.super_Material._vptr_Material = (_func_int **)&PTR_color_00115c70;
  ::image::Color::Color((Color *)&local_5d0,0.8,0.0,0.0);
  ::image::Color::Color((Color *)&local_8c8,0.0,0.0,0.8);
  math::identity();
  math::Matrix4d::scale((Matrix4d *)&local_2e0,(Matrix4d *)&local_3d0,1.5,1.5,1.5);
  math::Matrix4d::rotate_y((Matrix4d *)&local_828,(Matrix4d *)&local_2e0,1.0471966666666666);
  material::pattern::Pattern::Pattern
            (&local_1f0,(Color *)&local_5d0,(Color *)&local_8c8,(Matrix4d *)&local_828,0.1,0.9,1.0,
             200.0,0.0,0.0,1.0);
  local_1f0.super_Material._vptr_Material = (_func_int **)&PTR_color_00115bc8;
  ::image::Color::Color
            ((Color *)&local_530,0.8274509803921568,0.8509803921568627,0.9058823529411765);
  ::image::Color::Color((Color *)&local_730,0.5529411764705883,0.6,0.7294117647058823);
  math::identity();
  math::Matrix4d::scale((Matrix4d *)&local_5d0,(Matrix4d *)&local_8c8,0.25,0.25,0.25);
  math::Matrix4d::rotate_x((Matrix4d *)&local_3d0,(Matrix4d *)&local_5d0,2.094393333333333);
  math::Matrix4d::rotate_y((Matrix4d *)&local_828,(Matrix4d *)&local_3d0,-0.26179916666666664);
  material::pattern::Pattern::Pattern
            (&local_2e0,(Color *)&local_530,(Color *)&local_730,(Matrix4d *)&local_828,0.1,0.9,0.9,
             200.0,0.0,0.0,1.0);
  local_2e0.super_Material._vptr_Material = (_func_int **)&PTR_color_00115c38;
  ::image::Color::Color((Color *)&local_5d0,0.2,0.2,0.2);
  ::image::Color::Color((Color *)&local_8c8,0.7,0.7,0.7);
  math::identity();
  material::pattern::Pattern::Pattern
            (&local_3d0,(Color *)&local_5d0,(Color *)&local_8c8,(Matrix4d *)&local_828,0.1,0.9,0.9,
             200.0,1.0,0.0,1.0);
  local_3d0.super_Material._vptr_Material = (_func_int **)&PTR_color_00115b90;
  math::identity();
  local_8c8._vptr_Primitive = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<material::pattern::CheckerMaterial,std::allocator<material::pattern::CheckerMaterial>,material::pattern::CheckerMaterial&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_8c8.m_transformation,
             (CheckerMaterial **)&local_8c8,
             (allocator<material::pattern::CheckerMaterial> *)&local_530,
             (CheckerMaterial *)&local_3d0);
  local_978.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_8c8._vptr_Primitive;
  local_978.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8c8.m_transformation.m_buffer[0][0];
  local_8c8._vptr_Primitive = (_func_int **)0x0;
  local_8c8.m_transformation.m_buffer[0][0] = 0.0;
  geometry::primitive::Primitive::Primitive(&local_5d0,(Matrix4d *)&local_828,&local_978);
  local_5d0._vptr_Primitive = (_func_int **)&PTR_transform_00115878;
  if (local_978.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_978.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_8c8.m_transformation.m_buffer[0][0] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_8c8.m_transformation.m_buffer[0][0]);
  }
  math::identity();
  math::Matrix4d::translate((Matrix4d *)&local_828,(Matrix4d *)&local_530,-0.5,1.0,0.5);
  local_730._vptr_Primitive = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<material::pattern::GradientMaterial,std::allocator<material::pattern::GradientMaterial>,material::pattern::GradientMaterial&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_730.m_transformation,
             (GradientMaterial **)&local_730,
             (allocator<material::pattern::GradientMaterial> *)&local_670,
             (GradientMaterial *)&local_1f0);
  local_988.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_730._vptr_Primitive;
  local_988.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_730.m_transformation.m_buffer[0][0];
  local_730._vptr_Primitive = (_func_int **)0x0;
  local_730.m_transformation.m_buffer[0][0] = 0.0;
  geometry::primitive::Primitive::Primitive(&local_8c8,(Matrix4d *)&local_828,&local_988);
  local_8c8._vptr_Primitive = (_func_int **)&PTR_transform_00115960;
  if (local_988.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_988.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_730.m_transformation.m_buffer[0][0] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_730.m_transformation.m_buffer[0][0]);
  }
  math::identity();
  math::Matrix4d::scale((Matrix4d *)&local_730,(Matrix4d *)&local_670,0.5,0.5,0.5);
  math::Matrix4d::translate((Matrix4d *)&local_828,(Matrix4d *)&local_730,1.2,0.5,-0.5);
  local_a38._0_8_ = (RingMaterial *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<material::pattern::RingMaterial,std::allocator<material::pattern::RingMaterial>,material::pattern::RingMaterial&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a38 + 8),
             (RingMaterial **)local_a38,(allocator<material::pattern::RingMaterial> *)&local_450,
             (RingMaterial *)&local_2e0);
  local_998.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a38._0_8_;
  local_998.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a38._8_8_;
  local_a38._0_8_ = (RingMaterial *)0x0;
  local_a38._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  geometry::primitive::Primitive::Primitive(&local_530,(Matrix4d *)&local_828,&local_998);
  local_530._vptr_Primitive = (_func_int **)&PTR_transform_00115960;
  if (local_998.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_998.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a38._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a38._8_8_);
  }
  math::identity();
  math::Matrix4d::scale((Matrix4d *)local_a38,&local_450,0.33,0.33,0.33);
  math::Matrix4d::translate((Matrix4d *)&local_670,(Matrix4d *)local_a38,-1.5,0.33,-1.5);
  math::Matrix4d::rotate_y((Matrix4d *)&local_828,(Matrix4d *)&local_670,0.7853975);
  local_908.super_Light._vptr_Light = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<material::pattern::StripeMaterial,std::allocator<material::pattern::StripeMaterial>,material::pattern::StripeMaterial&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_908.super_Light.m_intensity,
             (StripeMaterial **)&local_908,
             (allocator<material::pattern::StripeMaterial> *)&local_690,(StripeMaterial *)&local_100
            );
  local_9a8.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_908.super_Light._vptr_Light;
  local_9a8.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.super_Light.m_intensity.r;
  local_908.super_Light._vptr_Light = (_func_int **)0x0;
  local_908.super_Light.m_intensity.r = 0.0;
  geometry::primitive::Primitive::Primitive(&local_730,(Matrix4d *)&local_828,&local_9a8);
  local_730._vptr_Primitive = (_func_int **)&PTR_transform_00115960;
  if (local_9a8.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_9a8.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.super_Light.m_intensity.r !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_908.super_Light.m_intensity.r);
  }
  math::identity();
  ::image::Color::Color((Color *)&local_450,0.8,0.8,0.8);
  material::ColorMaterial::ColorMaterial
            ((ColorMaterial *)local_a38,(Color *)&local_450,0.1,0.9,0.9,200.0,0.0,0.0,1.0);
  local_9b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
  local_9b0->_M_use_count = 1;
  local_9b0->_M_weak_count = 1;
  local_9b0->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00115738;
  local_a28._112_8_ = local_9b0 + 1;
  local_9b0[1]._vptr__Sp_counted_base = (_func_int **)&PTR___cxa_pure_virtual_00115620;
  local_9b0[1]._M_use_count = local_a38._8_4_;
  local_9b0[1]._M_weak_count = local_a38._12_4_;
  local_9b0[2]._vptr__Sp_counted_base = (_func_int **)local_a28._0_8_;
  local_9b0[2]._M_use_count = local_a28._8_4_;
  local_9b0[2]._M_weak_count = local_a28._12_4_;
  local_9b0[3]._vptr__Sp_counted_base = (_func_int **)local_a28._16_8_;
  local_9b0[3]._M_use_count = local_a28._24_4_;
  local_9b0[3]._M_weak_count = local_a28._28_4_;
  local_9b0[4]._vptr__Sp_counted_base = (_func_int **)local_a28._32_8_;
  local_9b0[4]._M_use_count = local_a28._40_4_;
  local_9b0[4]._M_weak_count = local_a28._44_4_;
  local_9b0[1]._vptr__Sp_counted_base = (_func_int **)&PTR_color_00115ca8;
  local_9b0[5]._vptr__Sp_counted_base = (_func_int **)local_a28._48_8_;
  local_9b0[5]._M_use_count = local_a28._56_4_;
  local_9b0[5]._M_weak_count = local_a28._60_4_;
  local_9b0[6]._vptr__Sp_counted_base = (_func_int **)local_a28._64_8_;
  geometry::Group::Group
            (&local_828,(Matrix4d *)&local_670,(shared_ptr<material::Material> *)(local_a28 + 0x70))
  ;
  if (local_9b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9b0);
  }
  geometry::Group::add_child(&local_828,&local_530);
  geometry::Group::add_child(&local_828,&local_730);
  geometry::Group::add_child(&local_828,&local_8c8);
  scene::World::add_object(&local_950,&local_5d0);
  scene::World::add_object(&local_950,&local_828.super_Primitive);
  ::image::Color::Color((Color *)local_a38,1.0,1.0,1.0);
  math::point(-5.0,5.0,-5.0);
  scene::light::PointLight::PointLight
            ((PointLight *)&local_450,(Color *)local_a38,(Tuple4d *)&local_670);
  ::image::Color::Color((Color *)local_a38,1.0,1.0,1.0);
  math::point(10.0,10.0,-10.0);
  scene::light::PointLight::PointLight(&local_908,(Color *)local_a38,(Tuple4d *)&local_670);
  scene::World::add_light(&local_950,(Light *)&local_450);
  scene::World::add_light(&local_950,&local_908.super_Light);
  ::image::Camera::Camera(&local_670,0x640,800,1.0471966666666666);
  math::point(0.0,1.5,-5.0);
  math::point(0.0,1.0,0.0);
  math::vector(0.0,1.0,0.0);
  math::view((Matrix4d *)local_a38,&local_690,&local_470,&local_490);
  ::image::Camera::transform(&local_670,(Matrix4d *)local_a38);
  std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Rendering image...\n",0x13);
  ::image::Camera::render(&local_968,&local_670,&local_950);
  std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Finished in ",0xc);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," seconds!\n",10);
  local_a38._0_8_ = (RingMaterial *)local_a28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"example.ppm","");
  ::image::Framebuffer::save_buffer(&local_968,(string *)local_a38);
  if ((RingMaterial *)local_a38._0_8_ != (RingMaterial *)local_a28) {
    operator_delete((void *)local_a38._0_8_,local_a28._0_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Press any key to exit.\n",0x17);
  ::image::Framebuffer::~Framebuffer(&local_968);
  local_828.super_Primitive._vptr_Primitive = (_func_int **)&PTR_transform_00115a50;
  if (local_828.m_children.
      super__Vector_base<geometry::primitive::Primitive_*,_std::allocator<geometry::primitive::Primitive_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_828.m_children.
                    super__Vector_base<geometry::primitive::Primitive_*,_std::allocator<geometry::primitive::Primitive_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_828.m_children.
                          super__Vector_base<geometry::primitive::Primitive_*,_std::allocator<geometry::primitive::Primitive_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_828.m_children.
                          super__Vector_base<geometry::primitive::Primitive_*,_std::allocator<geometry::primitive::Primitive_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_828.super_Primitive._vptr_Primitive = (_func_int **)&PTR_transform_001158c8;
  if (local_828.super_Primitive.material.
      super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_828.super_Primitive.material.
               super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  local_730._vptr_Primitive = (_func_int **)&PTR_transform_001158c8;
  if (local_730.material.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_730.material.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_530._vptr_Primitive = (_func_int **)&PTR_transform_001158c8;
  if (local_530.material.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.material.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_8c8._vptr_Primitive = (_func_int **)&PTR_transform_001158c8;
  if (local_8c8.material.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8c8.material.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_5d0._vptr_Primitive = (_func_int **)&PTR_transform_001158c8;
  if (local_5d0.material.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.material.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_950.m_objects.
      super__Vector_base<geometry::primitive::Primitive_*,_std::allocator<geometry::primitive::Primitive_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_950.m_objects.
                    super__Vector_base<geometry::primitive::Primitive_*,_std::allocator<geometry::primitive::Primitive_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_950.m_objects.
                          super__Vector_base<geometry::primitive::Primitive_*,_std::allocator<geometry::primitive::Primitive_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_950.m_objects.
                          super__Vector_base<geometry::primitive::Primitive_*,_std::allocator<geometry::primitive::Primitive_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_950.m_lights.
      super__Vector_base<scene::light::Light_*,_std::allocator<scene::light::Light_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_950.m_lights.
                    super__Vector_base<scene::light::Light_*,_std::allocator<scene::light::Light_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_950.m_lights.
                          super__Vector_base<scene::light::Light_*,_std::allocator<scene::light::Light_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_950.m_lights.
                          super__Vector_base<scene::light::Light_*,_std::allocator<scene::light::Light_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
    // create world
    scene::World world{};

    // setup materials
    material::pattern::StripeMaterial stripes{image::Color{215 / 255.0, 178 / 255.0, 255 / 255.0}, image::Color{147 / 255.0, 216 / 255.0, 148 / 255.0}, math::identity().scale(0.5, 0.5, 0.5), 0.1, 0.9, 1, 200};
    material::pattern::GradientMaterial gradient{image::Color{0.8, 0, 0}, image::Color{0, 0, 0.8}, math::identity().scale(1.5, 1.5, 1.5).rotate_y(constants::PI / 3), 0.1, 0.9, 1, 200};
    material::pattern::RingMaterial ring{image::Color{211 / 255.0, 217 / 255.0, 231 / 255.0}, image::Color{141 / 255.0, 153 / 255.0, 186 / 255.0}, math::identity().scale(0.25, 0.25, 0.25).rotate_x(constants::PI / 1.5).rotate_y(-constants::PI / 12)};
    material::pattern::CheckerMaterial grid{image::Color{0.2, 0.2, 0.2}, image::Color{0.7, 0.7, 0.7}, math::identity(), 0.1, 0.9, 0.9, 200, 1};

    // create objects with materials
    geometry::primitive::Plane floor{math::identity(), std::make_shared<material::pattern::CheckerMaterial>(grid)};
    geometry::primitive::Sphere middle{math::identity().translate(-0.5, 1, 0.5), std::make_shared<material::pattern::GradientMaterial>(gradient)};
    geometry::primitive::Sphere right{math::identity().scale(0.5, 0.5, 0.5).translate(1.2, 0.5, -0.5), std::make_shared<material::pattern::RingMaterial>(ring)};
    geometry::primitive::Sphere left{math::identity().scale(0.33, 0.33, 0.33).translate(-1.5, 0.33, -1.5).rotate_y(constants::PI / 4), std::make_shared<material::pattern::StripeMaterial>(stripes)};
    
    // group spheres together
    geometry::Group spheres{};
    spheres.add_child(&right);
    spheres.add_child(&left);
    spheres.add_child(&middle);

    // add objects to scene
    world.add_object(floor);
    world.add_object(spheres);

    // create lights
    scene::light::PointLight key{image::Color{1, 1, 1}, math::point(-5, 5, -5)};
    scene::light::PointLight fill{image::Color{1, 1, 1}, math::point(10, 10, -10)};

    // add lights to scene
    world.add_light(key);
    world.add_light(fill);

    // configure camera
    image::Camera camera{1600, 800, constants::PI / 3};
    math::Tuple4d from = math::point(0, 1.5, -5);
    math::Tuple4d to = math::point(0, 1, 0);
    math::Tuple4d up = math::vector(0, 1, 0);
    camera.transform(math::view(from, to, up));

    // render scene to buffer
    auto start = std::chrono::high_resolution_clock::now();
    std::cout << "Rendering image...\n";
    image::Framebuffer image = camera.render(world);
    auto stop = std::chrono::high_resolution_clock::now();
    std::cout << "Finished in " << (std::chrono::duration_cast<std::chrono::seconds>(stop - start)).count() << " seconds!\n";

    // write buffer to file
    image.save_buffer("example.ppm");
    std::cout << "Press any key to exit.\n";

    return 0;
}